

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

exr_result_t generic_unpack(exr_decode_pipeline_t *decode)

{
  char cVar1;
  uint16_t uVar2;
  int iVar3;
  exr_coding_channel_info_t *peVar4;
  uint8_t *puVar5;
  uint uVar6;
  char cVar7;
  int iVar8;
  short sVar9;
  int iVar10;
  float fVar11;
  long lVar12;
  ushort uVar13;
  uint uVar14;
  float fVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  void *pvVar19;
  long lVar20;
  float *pfVar21;
  
  iVar8 = (decode->chunk).height;
  if (iVar8 < 1) {
    return 0;
  }
  pvVar19 = decode->unpacked_buffer;
  sVar9 = decode->channel_count;
  uVar18 = 0;
  do {
    if (0 < sVar9) {
      iVar8 = (decode->chunk).start_y;
      peVar4 = decode->channels;
      lVar17 = 0;
      do {
        puVar5 = peVar4[lVar17].field_12.decode_to_ptr;
        iVar3 = peVar4[lVar17].width;
        uVar16 = peVar4[lVar17].y_samples;
        cVar1 = peVar4[lVar17].bytes_per_element;
        lVar20 = (long)peVar4[lVar17].user_pixel_stride;
        if ((int)uVar16 < 2) {
          if (puVar5 != (uint8_t *)0x0) {
            lVar12 = (long)peVar4[lVar17].user_line_stride * uVar18;
            goto LAB_00127034;
          }
LAB_00127110:
          pvVar19 = (void *)((long)pvVar19 + (long)(cVar1 * iVar3));
        }
        else if ((iVar8 + (int)uVar18) % (int)uVar16 == 0) {
          if (puVar5 == (uint8_t *)0x0) goto LAB_00127110;
          lVar12 = (long)peVar4[lVar17].user_line_stride * ((uVar18 & 0xffffffff) / (ulong)uVar16);
LAB_00127034:
          pfVar21 = (float *)(puVar5 + lVar12);
          uVar2 = peVar4[lVar17].data_type;
          if (uVar2 == 0) {
            uVar2 = peVar4[lVar17].user_data_type;
            if (uVar2 == 2) {
              if (0 < iVar3) {
                lVar12 = 0;
                do {
                  *pfVar21 = (float)*(uint *)((long)pvVar19 + lVar12 * 4);
                  pfVar21 = (float *)((long)pfVar21 + lVar20);
                  lVar12 = lVar12 + 1;
                } while (iVar3 != (int)lVar12);
              }
            }
            else if (uVar2 == 1) {
              if (0 < iVar3) {
                lVar12 = 0;
                do {
                  uVar16 = *(uint *)((long)pvVar19 + lVar12 * 4);
                  uVar13 = 0x7c00;
                  if (uVar16 < 0xffe1) {
                    fVar15 = (float)(int)uVar16;
                    if ((uint)fVar15 < 0x38800000) {
                      if ((uint)fVar15 < 0x33000001) {
                        uVar13 = 0;
                      }
                      else {
                        uVar16 = (uint)fVar15 & 0x7fffff | 0x800000;
                        cVar7 = (char)((uint)fVar15 >> 0x17);
                        uVar13 = (ushort)(uVar16 >> (0x7eU - cVar7 & 0x1f));
                        if (0x80000000 < uVar16 << (cVar7 + 0xa2U & 0x1f)) {
                          uVar13 = uVar13 + 1;
                        }
                      }
                    }
                    else if ((uint)fVar15 < 0x7f800000) {
                      if ((uint)fVar15 < 0x477ff000) {
                        uVar13 = (ushort)((int)fVar15 + 0x8000fff +
                                          (uint)(((uint)fVar15 >> 0xd & 1) != 0) >> 0xd);
                      }
                    }
                    else if (fVar15 != INFINITY) {
                      uVar16 = (uint)fVar15 >> 0xd & 0x3ff;
                      uVar13 = (ushort)(uVar16 == 0) | (ushort)uVar16 | 0x7c00;
                    }
                  }
                  *(ushort *)pfVar21 = uVar13;
                  pfVar21 = (float *)((long)pfVar21 + lVar20);
                  lVar12 = lVar12 + 1;
                } while (iVar3 != (int)lVar12);
              }
            }
            else {
              if (uVar2 != 0) {
                return 3;
              }
              if (0 < iVar3) {
                lVar12 = 0;
                do {
                  *pfVar21 = *(float *)((long)pvVar19 + lVar12 * 4);
                  pfVar21 = (float *)((long)pfVar21 + lVar20);
                  lVar12 = lVar12 + 1;
                } while (iVar3 != (int)lVar12);
              }
            }
          }
          else if (uVar2 == 2) {
            uVar2 = peVar4[lVar17].user_data_type;
            if (uVar2 == 2) {
              if (0 < iVar3) {
                lVar12 = 0;
                do {
                  *pfVar21 = *(float *)((long)pvVar19 + lVar12 * 4);
                  pfVar21 = (float *)((long)pfVar21 + lVar20);
                  lVar12 = lVar12 + 1;
                } while (iVar3 != (int)lVar12);
              }
            }
            else if (uVar2 == 1) {
              if (0 < iVar3) {
                lVar12 = 0;
                do {
                  uVar16 = *(uint *)((long)pvVar19 + lVar12 * 4);
                  uVar14 = uVar16 & 0x7fffffff;
                  uVar13 = (ushort)(uVar16 >> 0x10) & 0x8000;
                  if (uVar14 < 0x38800000) {
                    if ((0x33000000 < uVar14) &&
                       (uVar16 = uVar16 & 0x7fffff | 0x800000, cVar7 = (char)(uVar14 >> 0x17),
                       uVar13 = uVar13 | (ushort)(uVar16 >> (0x7eU - cVar7 & 0x1f)),
                       0x80000000 < uVar16 << (cVar7 + 0xa2U & 0x1f))) {
                      uVar13 = uVar13 + 1;
                    }
                  }
                  else if (uVar14 < 0x7f800000) {
                    if (uVar14 < 0x477ff000) {
                      uVar13 = (ushort)(uVar14 + 0x8000fff + (uint)((uVar14 >> 0xd & 1) != 0) >> 0xd
                                       ) | uVar13;
                    }
                    else {
                      uVar13 = uVar13 | 0x7c00;
                    }
                  }
                  else {
                    uVar13 = uVar13 | 0x7c00;
                    if (uVar14 != 0x7f800000) {
                      uVar16 = uVar14 >> 0xd & 0x3ff;
                      uVar13 = uVar13 | (ushort)uVar16 | (ushort)(uVar16 == 0);
                    }
                  }
                  *(ushort *)pfVar21 = uVar13;
                  pfVar21 = (float *)((long)pfVar21 + lVar20);
                  lVar12 = lVar12 + 1;
                } while (iVar3 != (int)lVar12);
              }
            }
            else {
              if (uVar2 != 0) {
                return 3;
              }
              if (0 < iVar3) {
                lVar12 = 0;
                do {
                  fVar15 = *(float *)((long)pvVar19 + lVar12 * 4);
                  fVar11 = 0.0;
                  if (0.0 <= fVar15) {
                    fVar11 = (float)(long)fVar15;
                    if (ABS(fVar15) == INFINITY) {
                      fVar11 = -NAN;
                    }
                    if (4.2949673e+09 < fVar15) {
                      fVar11 = -NAN;
                    }
                  }
                  *pfVar21 = fVar11;
                  pfVar21 = (float *)((long)pfVar21 + lVar20);
                  lVar12 = lVar12 + 1;
                } while (iVar3 != (int)lVar12);
              }
            }
          }
          else {
            if (uVar2 != 1) {
              return 3;
            }
            uVar2 = peVar4[lVar17].user_data_type;
            if (uVar2 == 2) {
              if (0 < iVar3) {
                lVar12 = 0;
                do {
                  uVar16 = (uint)*(short *)((long)pvVar19 + lVar12 * 2);
                  uVar14 = (uVar16 & 0x7fff) << 0xd;
                  fVar15 = (float)(uVar16 & 0x80000000);
                  if (uVar14 < 0x800000) {
                    if ((uVar16 & 0x7fff) != 0) {
                      uVar6 = 0x1f;
                      if ((uVar16 & 0x7fff) != 0) {
                        for (; uVar14 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                        }
                      }
                      iVar10 = (uVar6 ^ 0x1f) - 8;
                      fVar15 = (float)(((uint)fVar15 | uVar14 << ((byte)iVar10 & 0x1f) | 0x38800000)
                                      + iVar10 * -0x800000);
                    }
                  }
                  else if (uVar14 < 0xf800000) {
                    fVar15 = (float)(((uint)fVar15 | uVar14) + 0x38000000);
                  }
                  else {
                    fVar15 = (float)((uint)fVar15 | uVar14 | 0x7f800000);
                  }
                  *pfVar21 = fVar15;
                  pfVar21 = (float *)((long)pfVar21 + lVar20);
                  lVar12 = lVar12 + 1;
                } while (iVar3 != (int)lVar12);
              }
            }
            else if (uVar2 == 1) {
              if (0 < iVar3) {
                lVar12 = 0;
                do {
                  *(ushort *)pfVar21 = *(ushort *)((long)pvVar19 + lVar12 * 2);
                  pfVar21 = (float *)((long)pfVar21 + lVar20);
                  lVar12 = lVar12 + 1;
                } while (iVar3 != (int)lVar12);
              }
            }
            else {
              if (uVar2 != 0) {
                return 3;
              }
              if (0 < iVar3) {
                lVar12 = 0;
                do {
                  uVar13 = *(ushort *)((long)pvVar19 + lVar12 * 2);
                  uVar16 = (uint)uVar13;
                  if ((short)uVar13 < 0) {
                    fVar15 = 0.0;
                  }
                  else if ((~uVar16 & 0x7c00) == 0) {
                    fVar15 = (float)-(uint)((uVar13 & 0x3ff) == 0);
                  }
                  else {
                    uVar14 = uVar16 * 0x2000;
                    if (uVar16 < 0x400) {
                      if (uVar13 == 0) {
                        fVar15 = 0.0;
                      }
                      else {
                        uVar6 = 0x1f;
                        if (uVar16 != 0) {
                          for (; uVar14 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                          }
                        }
                        iVar10 = (uVar6 ^ 0x1f) - 8;
                        fVar15 = (float)((uVar14 << ((byte)iVar10 & 0x1f) | 0x38800000) +
                                        iVar10 * -0x800000);
                      }
                    }
                    else if (uVar16 < 0x7c00) {
                      fVar15 = (float)(uVar14 + 0x38000000);
                    }
                    else {
                      fVar15 = (float)(uVar14 | 0x7f800000);
                    }
                    fVar15 = (float)(long)fVar15;
                  }
                  *pfVar21 = fVar15;
                  pfVar21 = (float *)((long)pfVar21 + lVar20);
                  lVar12 = lVar12 + 1;
                } while (iVar3 != (int)lVar12);
              }
            }
          }
          pvVar19 = (void *)((long)pvVar19 + (long)(iVar3 * cVar1));
          sVar9 = decode->channel_count;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < sVar9);
      iVar8 = (decode->chunk).height;
    }
    uVar18 = uVar18 + 1;
    if ((long)iVar8 <= (long)uVar18) {
      return 0;
    }
  } while( true );
}

Assistant:

static exr_result_t
generic_unpack (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    uint8_t*       cdata;
    int            w, bpc, ubpc;

    for (int y = 0; y < decode->chunk.height; ++y)
    {
        int cury = y + decode->chunk.start_y;

        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata = decc->decode_to_ptr;
            w     = decc->width;
            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_pixel_stride;

            if (decc->y_samples > 1)
            {
                if ((cury % decc->y_samples) != 0) continue;
                if (cdata)
                    cdata +=
                        ((uint64_t) (y / decc->y_samples) *
                         (uint64_t) decc->user_line_stride);
                else
                {
                    srcbuffer += w * bpc;
                    continue;
                }
            }
            else if (cdata)
            {
                cdata += ((uint64_t) y) * ((uint64_t) decc->user_line_stride);
            }
            else
            {
                srcbuffer += w * bpc;
                continue;
            }

            UNPACK_SAMPLES (w)
            srcbuffer += w * bpc;
        }
    }
    return EXR_ERR_SUCCESS;
}